

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O0

int __thiscall QAccessibleTable::indexOfChild(QAccessibleTable *this,QAccessibleInterface *iface)

{
  int iVar1;
  QAbstractItemView *pQVar2;
  QAbstractItemModel *pQVar3;
  QAccessibleTable *this_00;
  QAbstractItemView *pQVar4;
  QHeaderView *pQVar5;
  QDebug *o;
  QModelIndex *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  QAccessibleTableHeaderCell *cell_2;
  QAccessibleTableHeaderCell *cell_1;
  QAccessibleTableCell *cell;
  QAccessibleInterface *parent;
  QAbstractItemModel *theModel;
  QAbstractItemView *theView;
  QModelIndex rootIndex;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  undefined4 in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff24;
  QAbstractItemView *in_stack_ffffffffffffff30;
  QDebug *in_stack_ffffffffffffff38;
  undefined8 in_stack_ffffffffffffff40;
  Role value;
  QString *t;
  int local_8c;
  undefined1 local_88 [56];
  QDebug local_50;
  QDebug local_48;
  QDebug local_40;
  QPersistentModelIndex local_38 [3];
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  value = (Role)((ulong)in_stack_ffffffffffffff40 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  t = in_RDI;
  pQVar2 = view((QAccessibleTable *)0x7f59f5);
  if (pQVar2 == (QAbstractItemView *)0x0) {
    local_8c = -1;
  }
  else {
    pQVar3 = QAbstractItemView::model(in_stack_ffffffffffffff30);
    if (pQVar3 == (QAbstractItemModel *)0x0) {
      local_8c = -1;
    }
    else {
      this_00 = (QAccessibleTable *)(**(code **)(*(long *)in_RSI + 0x40))();
      pQVar4 = (QAbstractItemView *)(**(code **)(*(long *)this_00 + 0x18))();
      if (pQVar4 == pQVar2) {
        local_20 = &DAT_aaaaaaaaaaaaaaaa;
        local_18 = &DAT_aaaaaaaaaaaaaaaa;
        local_10 = &DAT_aaaaaaaaaaaaaaaa;
        QAbstractItemView::rootIndex
                  ((QAbstractItemView *)
                   CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
        iVar1 = (**(code **)(*(long *)in_RSI + 0x78))();
        if ((iVar1 == 0x1d) || (iVar1 = (**(code **)(*(long *)in_RSI + 0x78))(), iVar1 == 0x22)) {
          QPersistentModelIndex::operator_cast_to_QModelIndex(local_38);
          local_8c = logicalIndex(this_00,in_RSI);
        }
        else {
          iVar1 = (**(code **)(*(long *)in_RSI + 0x78))();
          if (iVar1 == 0x19) {
            local_8c = in_RSI[1].r;
            pQVar5 = verticalHeader((QAccessibleTable *)CONCAT44(local_8c,in_stack_ffffffffffffff20)
                                   );
            local_8c = local_8c + (uint)(pQVar5 != (QHeaderView *)0x0);
          }
          else {
            iVar1 = (**(code **)(*(long *)in_RSI + 0x78))();
            if (iVar1 == 0x1a) {
              local_8c = in_RSI[1].r + 1;
              iVar1 = (**(code **)(*(long *)pQVar3 + 0x80))(pQVar3,&local_20);
              local_8c = local_8c * (iVar1 + 1);
            }
            else {
              iVar1 = (**(code **)(*(long *)in_RSI + 0x78))();
              if (iVar1 == 0x10) {
                local_8c = 0;
              }
              else {
                QMessageLogger::QMessageLogger
                          ((QMessageLogger *)in_stack_ffffffffffffff30,(char *)in_RDI,
                           in_stack_ffffffffffffff24,
                           (char *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
                QMessageLogger::warning();
                o = QDebug::operator<<(in_stack_ffffffffffffff38,(char *)t);
                QDebug::QDebug(&local_48,o);
                (**(code **)(*(long *)in_RSI + 0x78))();
                ::operator<<((QDebug *)this_00,value);
                (**(code **)(*(long *)in_RSI + 0x60))(local_88,in_RSI,0);
                QDebug::operator<<((QDebug *)in_stack_ffffffffffffff30,in_RDI);
                QString::~QString((QString *)0x7f5c56);
                QDebug::~QDebug(&local_40);
                QDebug::~QDebug(&local_48);
                QDebug::~QDebug(&local_50);
                local_8c = -1;
              }
            }
          }
        }
      }
      else {
        local_8c = -1;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_8c;
  }
  __stack_chk_fail();
}

Assistant:

int QAccessibleTable::indexOfChild(const QAccessibleInterface *iface) const
{
    const QAbstractItemView *theView = view();
    if (!theView)
        return -1;
    const QAbstractItemModel *theModel = theView->model();
    if (!theModel)
        return -1;
    QAccessibleInterface *parent = iface->parent();
    if (parent->object() != theView)
        return -1;

    const QModelIndex rootIndex = theView->rootIndex();
    Q_ASSERT(iface->role() != QAccessible::TreeItem); // should be handled by tree class
    if (iface->role() == QAccessible::Cell || iface->role() == QAccessible::ListItem) {
        const QAccessibleTableCell* cell = static_cast<const QAccessibleTableCell*>(iface);
        return logicalIndex(cell->m_index);
    } else if (iface->role() == QAccessible::ColumnHeader){
        const QAccessibleTableHeaderCell* cell = static_cast<const QAccessibleTableHeaderCell*>(iface);
        return cell->index + (verticalHeader() ? 1 : 0);
    } else if (iface->role() == QAccessible::RowHeader){
        const QAccessibleTableHeaderCell* cell = static_cast<const QAccessibleTableHeaderCell*>(iface);
        return (cell->index + 1) * (theModel->columnCount(rootIndex) + 1);
    } else if (iface->role() == QAccessible::Pane) {
        return 0; // corner button
    } else {
        qWarning() << "WARNING QAccessibleTable::indexOfChild Fix my children..."
                   << iface->role() << iface->text(QAccessible::Name);
    }
    // FIXME: we are in denial of our children. this should stop.
    return -1;
}